

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * __thiscall ghc::filesystem::path::root_directory(path *__return_storage_ptr__,path *this)

{
  bool bVar1;
  int iVar2;
  allocator<char> local_39;
  string_type local_38;
  path *local_18;
  path *this_local;
  
  local_18 = this;
  this_local = __return_storage_ptr__;
  bVar1 = has_root_directory(this);
  if (bVar1) {
    if (root_directory()::_root_dir == '\0') {
      iVar2 = __cxa_guard_acquire(&root_directory()::_root_dir);
      if (iVar2 != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,1,'/',&local_39);
        path(&root_directory::_root_dir,&local_38,native_format);
        std::__cxx11::string::~string((string *)&local_38);
        std::allocator<char>::~allocator(&local_39);
        __cxa_atexit(~path,&root_directory::_root_dir,&__dso_handle);
        __cxa_guard_release(&root_directory()::_root_dir);
      }
    }
    path(__return_storage_ptr__,&root_directory::_root_dir);
  }
  else {
    path(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::root_directory() const
{
    if (has_root_directory()) {
        static const path _root_dir(std::string(1, preferred_separator), native_format);
        return _root_dir;
    }
    return path();
}